

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::allocateBuckets(DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                  *this,uint Num)

{
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar1;
  
  this->NumBuckets = Num;
  if (Num == 0) {
    pDVar1 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
  }
  else {
    pDVar1 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)operator_new((ulong)Num << 4);
  }
  this->Buckets = pDVar1;
  return Num != 0;
}

Assistant:

bool allocateBuckets(unsigned Num) {
    NumBuckets = Num;
    if (NumBuckets == 0) {
      Buckets = nullptr;
      return false;
    }

    Buckets = static_cast<BucketT*>(operator new(sizeof(BucketT) * NumBuckets));
    return true;
  }